

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

void __thiscall MipsParser::setOmittedRegisters(MipsParser *this,tMipsOpcode *opcode)

{
  uint uVar1;
  
  uVar1 = opcode->flags;
  if ((uVar1 & 4) != 0) {
    MipsRegisterValue::operator=(&(this->registers).grd,(MipsRegisterValue *)this);
    uVar1 = opcode->flags;
  }
  if ((uVar1 & 8) != 0) {
    MipsRegisterValue::operator=(&(this->registers).grt,(MipsRegisterValue *)this);
    uVar1 = opcode->flags;
  }
  if ((uVar1 & 0x10) != 0) {
    MipsRegisterValue::operator=(&(this->registers).grt,&(this->registers).grd);
    uVar1 = opcode->flags;
  }
  if ((uVar1 >> 9 & 1) != 0) {
    MipsRegisterValue::operator=(&(this->registers).frd,&(this->registers).frs);
    uVar1 = opcode->flags;
  }
  if ((uVar1 >> 0x18 & 1) == 0) {
    return;
  }
  MipsRegisterValue::operator=(&(this->registers).rspvrd,&(this->registers).rspvrs);
  return;
}

Assistant:

void MipsParser::setOmittedRegisters(const tMipsOpcode& opcode)
{
	// copy over omitted registers
	if (opcode.flags & MO_RSD)
		registers.grd = registers.grs;

	if (opcode.flags & MO_RST)
		registers.grt = registers.grs;

	if (opcode.flags & MO_RDT)
		registers.grt = registers.grd;

	if (opcode.flags & MO_FRSD)
		registers.frd = registers.frs;

	if (opcode.flags & MO_RSP_VRSD)
		registers.rspvrd = registers.rspvrs;
}